

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.h
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_CallI<Js::OpLayoutDynamicProfile<Js::OpLayoutT_CallIWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutDynamicProfile<Js::OpLayoutT_CallIWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>_>
          *playout)

{
  Var target;
  RecyclableObject *function;
  OpLayoutDynamicProfile<Js::OpLayoutT_CallIWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>_>
  *playout_local;
  InterpreterStackFrame *this_local;
  
  target = GetRegAllowStackVar<unsigned_int>
                     (this,(playout->
                           super_OpLayoutT_CallIWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>
                           ).super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>.
                           Function);
  function = OP_CallGetFunc(this,target);
  OP_CallCommon<Js::OpLayoutDynamicProfile<Js::OpLayoutT_CallIWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>__unaligned>
            (this,playout,function,0,(AuxArray<unsigned_int> *)0x0);
  return;
}

Assistant:

void OP_CallIExtended(const unaligned T* playout) { OP_CallCommon(playout, OP_CallGetFunc(GetRegAllowStackVar(playout->Function)), Js::CallFlags_None, (playout->Options & CallIExtended_SpreadArgs) ? m_reader.ReadAuxArray<uint32>(playout->SpreadAuxOffset, this->GetFunctionBody()) : nullptr); }